

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O3

void __thiscall QPDF_String::writeJSON(QPDF_String *this,int json_version,Writer *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string test;
  string candidate;
  string local_80;
  string local_60;
  string local_40;
  
  getUTF8Val_abi_cxx11_(&local_60,this);
  if (json_version == 1) {
    (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
    JSON::Writer::encode_string(&local_80,&local_60);
    (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
    (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
LAB_00202c4d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00202c68;
  }
  else {
    bVar2 = QUtil::is_utf16(&this->val);
    if ((bVar2) || (bVar2 = QUtil::is_explicit_utf8(&this->val), bVar2)) {
      (*p->p->_vptr_Pipeline[2])(p->p,"\"u:",3);
      JSON::Writer::encode_string(&local_80,&local_60);
      (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
      (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
      goto LAB_00202c4d;
    }
    bVar2 = useHexString(this);
    if (bVar2) {
LAB_00202c03:
      (*p->p->_vptr_Pipeline[2])(p->p,"\"b:",3);
      QUtil::hex_encode(&local_80,&this->val);
      (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
      (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
      goto LAB_00202c4d;
    }
    paVar1 = &local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = QUtil::utf8_to_pdf_doc(&local_60,&local_80,'?');
    if (((!bVar2) || (local_80._M_string_length != (this->val)._M_string_length)) ||
       ((local_80._M_string_length != 0 &&
        (iVar3 = bcmp(local_80._M_dataplus._M_p,(this->val)._M_dataplus._M_p,
                      local_80._M_string_length), iVar3 != 0)))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_00202c03;
    }
    (*p->p->_vptr_Pipeline[2])(p->p,"\"u:",3);
    JSON::Writer::encode_string(&local_40,&local_60);
    (*p->p->_vptr_Pipeline[2])(p->p,local_40._M_dataplus._M_p,local_40._M_string_length);
    (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar1) goto LAB_00202c68;
  }
  operator_delete(local_80._M_dataplus._M_p,
                  CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                           local_80.field_2._M_local_buf[0]) + 1);
LAB_00202c68:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDF_String::writeJSON(int json_version, JSON::Writer& p)
{
    auto candidate = getUTF8Val();
    if (json_version == 1) {
        p << "\"" << JSON::Writer::encode_string(candidate) << "\"";
    } else {
        // See if we can unambiguously represent as Unicode.
        if (QUtil::is_utf16(this->val) || QUtil::is_explicit_utf8(this->val)) {
            p << "\"u:" << JSON::Writer::encode_string(candidate) << "\"";
            return;
        } else if (!useHexString()) {
            std::string test;
            if (QUtil::utf8_to_pdf_doc(candidate, test, '?') && (test == this->val)) {
                // This is a PDF-doc string that can be losslessly encoded as Unicode.
                p << "\"u:" << JSON::Writer::encode_string(candidate) << "\"";
                return;
            }
        }
        p << "\"b:" << QUtil::hex_encode(val) << "\"";
    }
}